

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

string * __thiscall
cmCryptoHash::HashString_abi_cxx11_
          (string *__return_storage_ptr__,cmCryptoHash *this,string_view input)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  cmCryptoHash *local_28;
  cmCryptoHash *this_local;
  string_view input_local;
  
  input_local._M_len = (size_t)input._M_str;
  this_local = (cmCryptoHash *)input._M_len;
  local_28 = this;
  input_local._M_str = (char *)__return_storage_ptr__;
  ByteHashString(&local_40,this,input);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_40,hash);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashString(cm::string_view input)
{
  return ByteHashToString(this->ByteHashString(input));
}